

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

int name2id(name_map *map,int max,char *name)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = 0;
  if (0 < max) {
    uVar4 = (ulong)(uint)max;
  }
  lVar1 = -0x10;
  do {
    lVar3 = lVar1;
    if (uVar4 * 0x10 == lVar3 + 0x10) {
      return -1;
    }
    iVar2 = strcmp(*(char **)((long)&map[1].name + lVar3),name);
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  return *(int *)((long)&map[1].id + lVar3);
}

Assistant:

int name2id(const name_map* map, int max, const char *name)
{
	int i;

	for (i = 0; i < max; i++) {
		if (!strcmp(map[i].name, name)) {
			return map[i].id;
		}
	}

	// nothing match
	return -1;
}